

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

bool __thiscall
ON_NurbsCage::SetCV(ON_NurbsCage *this,int i,int j,int k,point_style style,double *Point)

{
  double dVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  double *__dest;
  ulong uVar5;
  
  if (this->m_cv == (double *)0x0) {
    __dest = (double *)0x0;
  }
  else {
    __dest = this->m_cv +
             (long)i * (long)this->m_cv_stride[0] +
             (long)j * (long)this->m_cv_stride[1] + (long)k * (long)this->m_cv_stride[2];
  }
  if (__dest == (double *)0x0) {
LAB_00555b94:
    return false;
  }
  switch(style) {
  case not_rational:
    memcpy(__dest,Point,(long)this->m_dim << 3);
    if (this->m_is_rat == true) {
      __dest[this->m_dim] = 1.0;
      return true;
    }
    return true;
  case homogeneous_rational:
    lVar3 = (long)this->m_dim;
    if (this->m_is_rat != true) {
      if (0 < this->m_dim) {
        dVar1 = Point[lVar3];
        uVar5 = -(ulong)(dVar1 != 0.0);
        lVar4 = 0;
        do {
          __dest[lVar4] =
               Point[lVar4] * (double)(~uVar5 & 0x3ff0000000000000 | (ulong)(1.0 / dVar1) & uVar5);
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
        return true;
      }
      return true;
    }
    __n = lVar3 * 8 + 8;
    goto LAB_00555b87;
  case euclidean_rational:
    iVar2 = this->m_dim;
    lVar3 = (long)iVar2;
    if (this->m_is_rat == true) {
      dVar1 = Point[lVar3];
      if (0 < iVar2) {
        do {
          __dest[i] = Point[i] * dVar1;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      __dest[lVar3] = dVar1;
      return true;
    }
    break;
  case intrinsic_point_style:
    lVar3 = (long)this->m_dim + (ulong)this->m_is_rat;
    break;
  default:
    goto LAB_00555b94;
  }
  __n = lVar3 << 3;
LAB_00555b87:
  memcpy(__dest,Point,__n);
  return true;
}

Assistant:

bool ON_NurbsCage::SetCV( int i, int j, int k, ON::point_style style, const double* Point )
{
  bool rc = true;
  int n;
  double w;

  double* cv = CV(i,j,k);
  if ( !cv )
    return false;

  switch ( style ) {

  case ON::not_rational:  // input Point is not rational
    memcpy( cv, Point, m_dim*sizeof(*cv) );
    if ( IsRational() ) {
      // NURBS surface is rational - set weight to one
      cv[m_dim] = 1.0;
    }
    break;

  case ON::homogeneous_rational:  // input Point is homogeneous rational
    if ( IsRational() ) {
      // NURBS surface is rational
      memcpy( cv, Point, (m_dim+1)*sizeof(*cv) );
    }
    else {
      // NURBS surface is not rational
      w = (Point[m_dim] != 0.0) ? 1.0/Point[m_dim] : 1.0;
      for ( n = 0; n < m_dim; n++ ) {
        cv[n] = w*Point[n];
      }
    }
    break;

  case ON::euclidean_rational:  // input Point is euclidean rational
    if ( IsRational() ) {
      // NURBS surface is rational - convert euclean point to homogeneous form
      w = Point[m_dim];
      for ( n = 0; n < m_dim; n++ )
        cv[i] = w*Point[i];
      cv[m_dim] = w;
    }
    else {
      // NURBS surface is not rational
      memcpy( cv, Point, m_dim*sizeof(*cv) );
    }
    break;

  case ON::intrinsic_point_style:
    n = m_is_rat?m_dim+1:m_dim;
    memcpy(cv,Point,n*sizeof(*cv));
    break;
    
  default:
    rc = false;
    break;
  }
  return rc;
}